

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kat.cpp
# Opt level: O0

void kat::
     WriteAndReadRows<std::map<kat::period_event,kat::fin_data,std::less<kat::period_event>,std::allocator<std::pair<kat::period_event_const,kat::fin_data>>>>
               (map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
                *data_lt,
               _func_void_map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>_ptr_fin_data_ptr
               **GetRow)

{
  FILE *__stream;
  size_type sVar1;
  pointer ppVar2;
  char *pcVar3;
  undefined1 local_1028 [8];
  fin_data row;
  iterator iter;
  _func_void_map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>_ptr_fin_data_ptr
  **GetRow_local;
  map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
  *data_lt_local;
  
  while (sVar1 = std::
                 map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
                 ::size(data_lt), sVar1 != 0) {
    row.data._4088_8_ =
         std::
         map<kat::period_event,_kat::fin_data,_std::less<kat::period_event>,_std::allocator<std::pair<const_kat::period_event,_kat::fin_data>_>_>
         ::begin(data_lt);
    __stream = _stdout;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_kat::period_event,_kat::fin_data>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_kat::period_event,_kat::fin_data>_> *)
                        (row.data + 0xff8));
    fprintf(__stream,"%s",(ppVar2->second).data);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_kat::period_event,_kat::fin_data>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_kat::period_event,_kat::fin_data>_> *)
                        (row.data + 0xff8));
    local_1028 = (undefined1  [8])(ppVar2->second).fin;
    std::
    map<kat::period_event,kat::fin_data,std::less<kat::period_event>,std::allocator<std::pair<kat::period_event_const,kat::fin_data>>>
    ::erase_abi_cxx11_((map<kat::period_event,kat::fin_data,std::less<kat::period_event>,std::allocator<std::pair<kat::period_event_const,kat::fin_data>>>
                        *)data_lt,(iterator)row.data._4088_8_);
    pcVar3 = fgets((char *)&row,0x1000,(FILE *)local_1028);
    if (pcVar3 != (char *)0x0) {
      (**GetRow)(data_lt,(fin_data *)local_1028);
    }
  }
  return;
}

Assistant:

inline void WriteAndReadRows(rowMapT &data_lt,
				     void (*&GetRow)(rowMapT&, const fin_data&)) {
		while (data_lt.size() != 0) {
			auto iter = data_lt.begin();
			fprintf(stdout, "%s", iter->second.data);

			fin_data row;
			row.fin = iter->second.fin;
			data_lt.erase(iter);
			if (fgets(row.data, sizeof(row.data), row.fin) != nullptr)
			{
				GetRow(data_lt, row);
			}
		}
	}